

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::undoPrimal
          (HighsPostsolveStack *this,HighsOptions *options,HighsSolution *solution,
          HighsInt report_col)

{
  long in_RDX;
  HighsBasis *in_RDI;
  HighsBasis basis;
  HighsInt in_stack_000000f4;
  HighsBasis *in_stack_000000f8;
  HighsSolution *in_stack_00000100;
  HighsOptions *in_stack_00000108;
  HighsPostsolveStack *in_stack_00000110;
  undefined1 in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff81;
  
  HighsDataStack::resetPosition((HighsDataStack *)in_RDI);
  HighsBasis::HighsBasis
            ((HighsBasis *)CONCAT71(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80));
  *(undefined1 *)(in_RDX + 1) = 0;
  undo(in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,in_stack_000000f4);
  HighsBasis::~HighsBasis(in_RDI);
  return;
}

Assistant:

void undoPrimal(const HighsOptions& options, HighsSolution& solution,
                  const HighsInt report_col = -1) {
    // Call to reductionValues.resetPosition(); seems unnecessary as
    // it's the first thing done in undo
    reductionValues.resetPosition();
    HighsBasis basis;
    basis.valid = false;
    solution.dual_valid = false;
    undo(options, solution, basis, report_col);
  }